

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::resize
          (ArrayBuilder<kj::HttpHeaders::Header> *this,size_t size)

{
  Header *location;
  size_t sVar1;
  Header *pHVar2;
  Header *target;
  size_t size_local;
  ArrayBuilder<kj::HttpHeaders::Header> *this_local;
  
  sVar1 = capacity(this);
  if (sVar1 < size) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
               ,0x1d3,"size <= capacity()","\"can\'t resize past capacity\"",
               "can\'t resize past capacity");
  }
  pHVar2 = this->ptr + size;
  if (this->pos < pHVar2) {
    while (this->pos < pHVar2) {
      location = this->pos;
      this->pos = location + 1;
      ctor<kj::HttpHeaders::Header>(location);
    }
  }
  else {
    this->pos = pHVar2;
  }
  return;
}

Assistant:

void resize(size_t size) {
    KJ_IREQUIRE(size <= capacity(), "can't resize past capacity");

    T* target = ptr + size;
    if (target > pos) {
      // expand
      if (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos < target) {
          kj::ctor(*pos++);
        }
      }
    } else {
      // truncate
      if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos > target) {
          kj::dtor(*--pos);
        }
      }
    }
  }